

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapContinent(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t uVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (0 < h) {
    lVar5 = (long)w + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar1 = l->startSeed;
    piVar4 = out + 1;
    lVar5 = 0;
    auVar6 = auVar6 ^ _DAT_0012dd60;
    do {
      if (0 < w) {
        iVar2 = z + (int)lVar5;
        lVar3 = 0;
        iVar7 = 0;
        iVar8 = 1;
        auVar18 = _DAT_0012dd50;
        do {
          auVar10 = auVar18 ^ _DAT_0012dd60;
          auVar14._0_4_ = -(uint)(auVar6._0_4_ < auVar10._0_4_);
          auVar14._4_4_ = -(uint)(auVar6._4_4_ < auVar10._4_4_);
          auVar14._8_4_ = -(uint)(auVar6._8_4_ < auVar10._8_4_);
          auVar14._12_4_ = -(uint)(auVar6._12_4_ < auVar10._12_4_);
          auVar11._4_4_ = -(uint)(auVar10._4_4_ == auVar6._4_4_);
          auVar11._12_4_ = -(uint)(auVar10._12_4_ == auVar6._12_4_);
          auVar11._0_4_ = auVar11._4_4_;
          auVar11._8_4_ = auVar11._12_4_;
          auVar20._4_4_ = auVar14._4_4_;
          auVar20._0_4_ = auVar14._4_4_;
          auVar20._8_4_ = auVar14._12_4_;
          auVar20._12_4_ = auVar14._12_4_;
          auVar20 = auVar20 | auVar11 & auVar14;
          iVar21 = iVar7 + x;
          auVar19._4_4_ = iVar8 + x;
          auVar19._8_4_ = auVar19._4_4_;
          auVar19._12_4_ = -(uint)(auVar19._4_4_ < 0);
          lVar13 = CONCAT44(-(uint)(iVar21 < 0),iVar21);
          auVar10._8_4_ = (int)uVar1;
          auVar10._0_8_ = uVar1;
          auVar10._12_4_ = (int)(uVar1 >> 0x20);
          uVar16 = uVar1 + lVar13;
          uVar17 = auVar10._8_8_ + auVar19._8_8_;
          uVar9 = (uVar16 & 0xffffffff) * 0x4c957f2d + 0x14057b7ef767814f +
                  ((uVar16 >> 0x20) * 0x4c957f2d + (uVar16 & 0xffffffff) * 0x5851f42d << 0x20);
          uVar12 = (uVar17 & 0xffffffff) * 0x4c957f2d + 0x14057b7ef767814f +
                   ((uVar17 >> 0x20) * 0x4c957f2d + (uVar17 & 0xffffffff) * 0x5851f42d << 0x20);
          uVar9 = (uVar9 & 0xffffffff) * (uVar16 & 0xffffffff) + (long)iVar2 +
                  ((uVar9 >> 0x20) * (uVar16 & 0xffffffff) + (uVar16 >> 0x20) * (uVar9 & 0xffffffff)
                  << 0x20);
          uVar12 = (uVar12 & 0xffffffff) * (uVar17 & 0xffffffff) + (long)iVar2 +
                   ((uVar12 >> 0x20) * (uVar17 & 0xffffffff) +
                    (uVar17 >> 0x20) * (uVar12 & 0xffffffff) << 0x20);
          uVar16 = (uVar9 & 0xffffffff) * 0x4c957f2d + 0x14057b7ef767814f +
                   ((uVar9 >> 0x20) * 0x4c957f2d + (uVar9 & 0xffffffff) * 0x5851f42d << 0x20);
          uVar17 = (uVar12 & 0xffffffff) * 0x4c957f2d + 0x14057b7ef767814f +
                   ((uVar12 >> 0x20) * 0x4c957f2d + (uVar12 & 0xffffffff) * 0x5851f42d << 0x20);
          lVar13 = (uVar16 & 0xffffffff) * (uVar9 & 0xffffffff) + lVar13 +
                   ((uVar16 >> 0x20) * (uVar9 & 0xffffffff) +
                    (uVar9 >> 0x20) * (uVar16 & 0xffffffff) << 0x20);
          lVar15 = (uVar17 & 0xffffffff) * (uVar12 & 0xffffffff) + auVar19._8_8_ +
                   ((uVar17 >> 0x20) * (uVar12 & 0xffffffff) +
                    (uVar12 >> 0x20) * (uVar17 & 0xffffffff) << 0x20);
          if ((~auVar20._0_4_ & 1) != 0) {
            uVar9 = ((lVar13 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar13 + (long)iVar2 >>
                    0x18) * -0x3333333333333333 + 0x1999999999999998;
            *(uint *)((long)piVar4 + lVar3 + -4) =
                 (uint)((uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f) < 0x1999999999999999);
          }
          if (((auVar20 ^ _DAT_0012e240) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            uVar9 = ((lVar15 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar15 + (long)iVar2 >>
                    0x18) * -0x3333333333333333 + 0x1999999999999998;
            *(uint *)((long)piVar4 + lVar3) =
                 (uint)((uVar9 >> 1 | (ulong)((uVar9 & 1) != 0) << 0x3f) < 0x1999999999999999);
          }
          lVar13 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar13 + 2;
          iVar7 = iVar7 + 2;
          iVar8 = iVar8 + 2;
          lVar3 = lVar3 + 8;
        } while ((ulong)(w + 1U >> 1) << 3 != lVar3);
      }
      lVar5 = lVar5 + 1;
      piVar4 = piVar4 + w;
    } while (lVar5 != h);
  }
  if ((x < 1 && -w < x) && (z < 1 && -h < z)) {
    out[(long)w * (ulong)(uint)-z - (long)x] = 1;
  }
  return 0;
}

Assistant:

int mapContinent(const Layer * l, int * out, int x, int z, int w, int h)
{
    uint64_t ss = l->startSeed;
    uint64_t cs;
    int64_t i, j;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            cs = getChunkSeed(ss, i + x, j + z);
            out[j*w + i] = mcFirstIsZero(cs, 10);
        }
    }

    if (x > -w && x <= 0 && z > -h && z <= 0)
    {
        out[-z * (int64_t)w - x] = 1;
    }

    return 0;
}